

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void soul::HTMLGenerator::addMarkdownAsHTML
               (HTMLElement *parent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  pointer *this;
  string_view s;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  reference pvVar6;
  HTMLElement *pHVar7;
  ulong uVar8;
  char *pcVar9;
  string_view sVar10;
  undefined1 auVar11 [16];
  string_view markdown;
  string local_378;
  string local_358;
  string_view local_338;
  string_view local_328;
  allocator<char> local_311;
  string local_310;
  string_view local_2f0;
  string_view local_2e0;
  anon_class_8_1_898a5aeb local_2d0;
  function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_2c8;
  string local_2a8;
  string local_288;
  CodeLocation local_268;
  string_view local_258;
  allocator<char> local_241;
  string local_240;
  HTMLElement *local_220;
  HTMLElement *code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  undefined1 local_1d8 [8];
  string type;
  size_type endOfLine1;
  char *local_1a8;
  string_view local_1a0;
  undefined4 local_18c;
  string local_188;
  string local_168;
  undefined1 local_148 [16];
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  value_type local_e8;
  ulong local_d8;
  size_type indent;
  size_type leadingSpaces;
  string local_b8;
  undefined1 local_98 [8];
  string trimmed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *paragraph;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  anon_class_16_2_580a6ad7 getParent;
  vector<ListLevel,_std::allocator<ListLevel>_> listStack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paragraphs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  HTMLElement *parent_local;
  
  groupMarkdownIntoParagraphs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,lines);
  std::vector<ListLevel,_std::allocator<ListLevel>_>::vector
            ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&getParent.parent;
  this = &listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  getParent.listStack = (vector<ListLevel,_std::allocator<ListLevel>_> *)parent;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
  paragraph = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&paragraph);
    if (!bVar2) {
      std::vector<ListLevel,_std::allocator<ListLevel>_>::~vector
                ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      return;
    }
    trimmed.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)&local_b8,(string *)trimmed.field_2._8_8_);
    choc::text::trimStart((string *)local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    indent = lVar4 - lVar5;
    bVar2 = isListMarker((string *)local_98);
    if (bVar2) {
      local_d8 = indent + 1;
      while( true ) {
        bVar3 = std::vector<ListLevel,_std::allocator<ListLevel>_>::empty
                          ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
        bVar2 = false;
        if (!bVar3) {
          pvVar6 = std::vector<ListLevel,_std::allocator<ListLevel>_>::back
                             ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
          bVar2 = local_d8 < pvVar6->indent;
        }
        if (!bVar2) break;
        std::vector<ListLevel,_std::allocator<ListLevel>_>::pop_back
                  ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
      }
      bVar2 = std::vector<ListLevel,_std::allocator<ListLevel>_>::empty
                        ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
      if (bVar2) {
LAB_00482491:
        pHVar7 = addMarkdownAsHTML::anon_class_16_2_580a6ad7::operator()
                           ((anon_class_16_2_580a6ad7 *)&__range2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ul",&local_109);
        local_e8.ul = choc::html::HTMLElement::addChild(pHVar7,&local_108);
        local_e8.indent = local_d8;
        std::vector<ListLevel,_std::allocator<ListLevel>_>::push_back
                  ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent,&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
      }
      else {
        pvVar6 = std::vector<ListLevel,_std::allocator<ListLevel>_>::back
                           ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
        if (pvVar6->indent < local_d8) goto LAB_00482491;
      }
      pvVar6 = std::vector<ListLevel,_std::allocator<ListLevel>_>::back
                         ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
      pHVar7 = pvVar6->ul;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"li",&local_131);
      pHVar7 = choc::html::HTMLElement::addChild(pHVar7,&local_130);
      pcVar9 = (char *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)&local_188,(ulong)local_98);
      choc::text::trimStart(&local_168,&local_188);
      auVar11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
      sVar10._M_len = auVar11._8_8_;
      sVar10._M_str = pcVar9;
      local_148 = auVar11;
      appendSpansForContent((HTMLGenerator *)pHVar7,auVar11._0_8_,sVar10);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      local_18c = 3;
    }
    else {
      std::vector<ListLevel,_std::allocator<ListLevel>_>::clear
                ((vector<ListLevel,_std::allocator<ListLevel>_> *)&getParent.parent);
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      local_1a0 = sVar10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&endOfLine1,"```");
      s._M_str = local_1a8;
      s._M_len = endOfLine1;
      pcVar9 = local_1a8;
      bVar2 = choc::text::startsWith(local_1a0,s);
      if (bVar2) {
        type.field_2._8_8_ = std::__cxx11::string::find((char)local_98,10);
        if (type.field_2._8_8_ != -1) {
          std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)local_98);
          choc::text::trim((string *)local_1d8,(string *)((long)&content.field_2 + 8));
          std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
          uVar1 = type.field_2._8_8_;
          lVar4 = std::__cxx11::string::length();
          if ((ulong)uVar1 < lVar4 - 1U) {
            type.field_2._8_8_ = type.field_2._8_8_ + 1;
          }
          std::__cxx11::string::substr((ulong)&code,(ulong)local_98);
          pHVar7 = addMarkdownAsHTML::anon_class_16_2_580a6ad7::operator()
                             ((anon_class_16_2_580a6ad7 *)&__range2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"code",&local_241)
          ;
          pHVar7 = choc::html::HTMLElement::addChild(pHVar7,&local_240);
          pHVar7 = choc::html::HTMLElement::setInline(pHVar7,true);
          std::__cxx11::string::~string((string *)&local_240);
          std::allocator<char>::~allocator(&local_241);
          local_220 = pHVar7;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d8,"soul");
          pHVar7 = local_220;
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_258,"hljs");
            choc::html::HTMLElement::setClass(pHVar7,local_258);
            std::__cxx11::string::string((string *)&local_288);
            std::__cxx11::string::string((string *)&local_2a8,(string *)&code);
            CodeLocation::createFromString(&local_268,&local_288,&local_2a8);
            local_2d0.code = local_220;
            std::
            function<bool(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
            ::
            function<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
                      ((function<bool(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
                        *)&local_2c8,&local_2d0);
            SourceCodeUtilities::iterateSyntaxTokens(&local_268,&local_2c8);
            std::
            function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::~function(&local_2c8);
            CodeLocation::~CodeLocation(&local_268);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::__cxx11::string::~string((string *)&local_288);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_2e0,"unspecified_code");
            pHVar7 = choc::html::HTMLElement::setClass(pHVar7,local_2e0);
            sVar10 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&code);
            local_2f0 = sVar10;
            choc::html::HTMLElement::addContent(pHVar7,sVar10);
          }
          std::__cxx11::string::~string((string *)&code);
          std::__cxx11::string::~string((string *)local_1d8);
        }
        local_18c = 3;
      }
      else if (indent < 4) {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pHVar7 = addMarkdownAsHTML::anon_class_16_2_580a6ad7::operator()
                             ((anon_class_16_2_580a6ad7 *)&__range2);
          pHVar7 = choc::html::HTMLElement::addParagraph(pHVar7);
          auVar11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
          markdown._M_len = auVar11._8_8_;
          markdown._M_str = pcVar9;
          appendSpansForContent((HTMLGenerator *)pHVar7,auVar11._0_8_,markdown);
        }
        local_18c = 0;
      }
      else {
        pHVar7 = addMarkdownAsHTML::anon_class_16_2_580a6ad7::operator()
                           ((anon_class_16_2_580a6ad7 *)&__range2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"code",&local_311);
        pHVar7 = choc::html::HTMLElement::addChild(pHVar7,&local_310);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_328,"unspecified_code");
        pHVar7 = choc::html::HTMLElement::setClass(pHVar7,local_328);
        pHVar7 = choc::html::HTMLElement::setInline(pHVar7,true);
        std::__cxx11::string::string((string *)&local_378,(string *)trimmed.field_2._8_8_);
        choc::text::trimEnd(&local_358,&local_378);
        sVar10 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_358);
        local_338 = sVar10;
        choc::html::HTMLElement::addContent(pHVar7,sVar10);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator(&local_311);
        local_18c = 3;
      }
    }
    std::__cxx11::string::~string((string *)local_98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void addMarkdownAsHTML (choc::html::HTMLElement& parent, const std::vector<std::string>& lines)
    {
        auto paragraphs = groupMarkdownIntoParagraphs (lines);

        struct ListLevel
        {
            choc::html::HTMLElement& ul;
            size_t indent;
        };

        std::vector<ListLevel> listStack;

        auto getParent = [&] () -> choc::html::HTMLElement& { return listStack.empty() ? parent : listStack.back().ul; };

        for (auto& paragraph : paragraphs)
        {
            auto trimmed = choc::text::trimStart (paragraph);
            auto leadingSpaces = paragraph.length() - trimmed.length();

            if (isListMarker (trimmed))
            {
                auto indent = 1 + leadingSpaces;

                while (! listStack.empty() && listStack.back().indent > indent)
                    listStack.pop_back();

                if (listStack.empty() || listStack.back().indent < indent)
                    listStack.push_back ({ getParent().addChild ("ul"), indent });

                appendSpansForContent (listStack.back().ul.addChild ("li"),
                                       choc::text::trimStart (trimmed.substr (2)));
                continue;
            }

            listStack.clear();

            if (choc::text::startsWith (trimmed, "```"))
            {
                auto endOfLine1 = trimmed.find ('\n');

                if (endOfLine1 != std::string::npos)
                {
                    auto type = choc::text::trim (trimmed.substr (3, endOfLine1 - 3));

                    if (endOfLine1 < trimmed.length() - 1)
                        ++endOfLine1;

                    auto content = trimmed.substr (endOfLine1);
                    auto& code = getParent().addChild ("code").setInline (true);

                    if (type == "soul")
                    {
                        code.setClass ("hljs");

                        SourceCodeUtilities::iterateSyntaxTokens (CodeLocation::createFromString ({}, std::move (content)),
                                                                  [&] (std::string_view token, std::string_view cssClass) -> bool
                        {
                            if (cssClass.empty())
                                code.addContent (token);
                            else
                                code.addSpan (cssClass).addContent (token);

                            return true;
                        });
                    }
                    else
                    {
                        code.setClass ("unspecified_code").addContent (content);
                    }
                }

                continue;
            }

            if (leadingSpaces >= 4)
            {
                getParent().addChild ("code").setClass ("unspecified_code").setInline (true)
                    .addContent (choc::text::trimEnd (paragraph));

                continue;
            }

            if (! trimmed.empty())
                appendSpansForContent (getParent().addParagraph(), trimmed);
        }
    }